

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<yb::Arrow_const&>::captureExpression<(Catch::Internal::Operator)0,yb::Arrow>
          (ExpressionLhs<yb::Arrow_const&> *this,Arrow *rhs)

{
  ResultBuilder *pRVar1;
  Arrow *v;
  Arrow *v_00;
  string local_88;
  string local_68;
  string local_48;
  allocator<char> local_21;
  
  pRVar1 = ResultBuilder::setResultType(*(ResultBuilder **)this,**(Arrow **)(this + 8) == *rhs);
  Detail::EnumStringMaker<yb::Arrow,true>::convert_abi_cxx11_
            (&local_88,*(EnumStringMaker<yb::Arrow,true> **)(this + 8),v);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_88);
  Detail::EnumStringMaker<yb::Arrow,true>::convert_abi_cxx11_
            (&local_68,(EnumStringMaker<yb::Arrow,true> *)rhs,v_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"==",&local_21);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }